

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cc
# Opt level: O0

void __thiscall TempFile::~TempFile(TempFile *this)

{
  TempFile *this_local;
  
  if (this->f != (FILE *)0x0) {
    fclose((FILE *)this->f);
  }
  std::__cxx11::string::~string((string *)&this->path);
  return;
}

Assistant:

~TempFile() {
    if (f) {
      (void)fclose(f);
    }
  }